

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O0

void __thiscall cmXMLWriter::Element(cmXMLWriter *this,char *name)

{
  bool bVar1;
  size_type indent;
  ostream *poVar2;
  char *name_local;
  cmXMLWriter *this_local;
  
  CloseStartElement(this);
  bVar1 = this->IsContent;
  indent = std::
           stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::size(&this->Elements);
  ConditionalLineBreak(this,(bool)((bVar1 ^ 0xffU) & 1),indent);
  poVar2 = std::operator<<(this->Output,'<');
  poVar2 = std::operator<<(poVar2,name);
  std::operator<<(poVar2,"/>");
  return;
}

Assistant:

void cmXMLWriter::Element(const char* name)
{
  this->CloseStartElement();
  this->ConditionalLineBreak(!this->IsContent, this->Elements.size());
  this->Output << '<' << name << "/>";
}